

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaOverlay.cpp
# Opt level: O2

void __thiscall SchemaAdapter::ShowOverlay(SchemaAdapter *this,size_t index)

{
  DoubleEntry *entry;
  
  entry = (DoubleEntry *)
          (**(code **)(*(long *)(this->schema).
                                super___shared_ptr<f8n::sdk::ISchema,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr + 0x10))();
  switch((entry->entry).type) {
  case Bool:
    ShowBoolOverlay(this,(BoolEntry *)entry);
    return;
  case Int:
    ShowIntOverlay(this,(IntEntry *)entry);
    return;
  case Double:
    ShowDoubleOverlay(this,entry);
    return;
  case String:
    ShowStringOverlay(this,(StringEntry *)entry);
    return;
  case Enum:
    ShowEnumOverlay(this,(EnumEntry *)entry);
    return;
  default:
    return;
  }
}

Assistant:

void ShowOverlay(size_t index) {
            auto entry = schema->At(index);
            switch (entry->type) {
                case ISchema::Type::Bool:
                    return ShowBoolOverlay(reinterpret_cast<const ISchema::BoolEntry*>(entry));
                case ISchema::Type::Int:
                    return ShowIntOverlay(reinterpret_cast<const ISchema::IntEntry*>(entry));
                case ISchema::Type::Double:
                    return ShowDoubleOverlay(reinterpret_cast<const ISchema::DoubleEntry*>(entry));
                case ISchema::Type::String:
                    return ShowStringOverlay(reinterpret_cast<const ISchema::StringEntry*>(entry));
                case ISchema::Type::Enum:
                    return ShowEnumOverlay(reinterpret_cast<const ISchema::EnumEntry*>(entry));
            }
        }